

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O2

string * __thiscall
MinVR::VRDataQueue::printQueue_abi_cxx11_(string *__return_storage_ptr__,VRDataQueue *this)

{
  _Base_ptr p_Var1;
  int iVar2;
  allocator<char> local_129;
  string *local_128;
  char buf [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string identifier;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var1 = (this->_dataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar2 = 1;
  local_128 = __return_storage_ptr__;
  while ((_Rb_tree_header *)p_Var1 != &(this->_dataMap)._M_t._M_impl.super__Rb_tree_header) {
    sprintf(buf,"%d",iVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&identifier,"element",(allocator<char> *)&local_70);
    std::__cxx11::string::append((char *)&identifier);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,buf,&local_129);
    std::operator+(&local_b0,&identifier,&local_d0);
    std::operator+(&local_110,&local_b0,": ");
    VRDataQueueItem::serialize_abi_cxx11_(&local_f0,(VRDataQueueItem *)&p_Var1[1]._M_left);
    std::operator+(&local_90,&local_110,&local_f0);
    std::operator+(&local_70,&local_90,"\n");
    std::__cxx11::string::append((string *)local_128);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&identifier);
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    iVar2 = iVar2 + 1;
  }
  return local_128;
}

Assistant:

std::string VRDataQueue::printQueue() const {

  std::string out;

  char buf[6];  // No queues more than a million entries long.
  int i = 0;
  for (VRDataList::const_iterator it = _dataMap.begin();
       it != _dataMap.end(); ++it) {
    sprintf(buf, "%d", ++i);
    std::string identifier = "element";
    if (it->second.isSerialized()) {
      identifier += "*";
    } else {
      identifier += " ";
    }
    out += identifier + std::string(buf) + ": " + it->second.serialize() + "\n";
  }

  return out;
}